

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Identifier.hpp
# Opt level: O0

void __thiscall Centaurus::Identifier::parse(Identifier *this,Stream *stream)

{
  bool bVar1;
  StreamException *__return_storage_ptr__;
  wstring local_58;
  wchar_t local_24;
  Sentry SStack_20;
  wchar_t ch;
  Sentry sentry;
  Stream *stream_local;
  Identifier *this_local;
  
  sentry._M_current = (wchar_t *)stream;
  SStack_20 = Stream::sentry_abi_cxx11_(stream);
  local_24 = Stream::get((Stream *)sentry._M_current);
  bVar1 = is_symbol_leader(local_24);
  if (!bVar1) {
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,(Stream *)sentry._M_current,local_24);
    __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,StreamException::~StreamException)
    ;
  }
  local_24 = Stream::peek((Stream *)sentry._M_current);
  while( true ) {
    bVar1 = is_symbol_char(local_24);
    if (!bVar1) break;
    Stream::discard((Stream *)sentry._M_current);
    local_24 = Stream::peek((Stream *)sentry._M_current);
  }
  Stream::cut(&local_58,(Stream *)sentry._M_current,&stack0xffffffffffffffe0);
  std::__cxx11::wstring::operator=((wstring *)&this->m_id,(wstring *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  return;
}

Assistant:

void parse(Stream& stream)
    {
        Stream::Sentry sentry = stream.sentry();

        wchar_t ch = stream.get();
        if (!is_symbol_leader(ch))
        {
            throw stream.unexpected(ch);
        }

        ch = stream.peek();
        for (; is_symbol_char(ch); ch = stream.peek())
        {
            stream.discard();
        }

        m_id = stream.cut(sentry);
    }